

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  N_Vector p_Var3;
  sunrealtype *psVar4;
  N_Vector *pp_Var5;
  long lVar6;
  sunrealtype *psVar7;
  sunrealtype *psVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  sunrealtype sVar15;
  int local_44;
  N_Vector local_40;
  sunrealtype *local_38;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    iVar9 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xc65,"arkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var3 = ark_mem->ycur;
    local_40 = ark_mem->tempv1;
    psVar4 = step_mem->cvals;
    pp_Var5 = step_mem->Xvecs;
    *dsmPtr = 0.0;
    local_38 = dsmPtr;
    if (step_mem->explicit == 0) {
      bVar14 = true;
    }
    else {
      iVar9 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Be);
      bVar14 = iVar9 != 0;
    }
    if ((step_mem->implicit != 0) &&
       (iVar9 = ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi), iVar9 == 0)) {
      bVar14 = false;
    }
    if (!bVar14) {
      *psVar4 = 1.0;
      *pp_Var5 = ark_mem->yn;
      iVar9 = step_mem->stages;
      lVar10 = (long)iVar9;
      if (lVar10 < 1) {
        local_44 = 1;
      }
      else {
        iVar1 = step_mem->explicit;
        iVar2 = step_mem->implicit;
        local_44 = 1;
        lVar11 = 0;
        do {
          if (iVar1 != 0) {
            psVar4[local_44] = ark_mem->h * step_mem->Be->b[lVar11];
            pp_Var5[local_44] = step_mem->Fe[lVar11];
            local_44 = local_44 + 1;
          }
          if (iVar2 != 0) {
            psVar4[local_44] = ark_mem->h * step_mem->Bi->b[lVar11];
            pp_Var5[local_44] = step_mem->Fi[lVar11];
            local_44 = local_44 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      lVar11 = 0x70;
      if ((step_mem->expforcing != 0) || (lVar11 = 0x78, step_mem->impforcing != 0)) {
        if (0 < iVar9) {
          lVar11 = *(long *)((long)&step_mem->fe + lVar11);
          lVar6 = *(long *)(lVar11 + 0x18);
          lVar11 = *(long *)(lVar11 + 0x20);
          psVar7 = step_mem->stage_times;
          psVar8 = step_mem->stage_coefs;
          lVar12 = 0;
          do {
            psVar7[lVar12] = *(double *)(lVar6 + lVar12 * 8) * ark_mem->h + ark_mem->tn;
            psVar8[lVar12] = ark_mem->h * *(double *)(lVar11 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar10 != lVar12);
        }
        arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,iVar9,&local_44);
      }
      iVar9 = N_VLinearCombination(local_44,psVar4,pp_Var5,p_Var3);
      if (iVar9 != 0) {
        return -0x1c;
      }
    }
    if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
      iVar9 = step_mem->stages;
      lVar10 = (long)iVar9;
      if (lVar10 < 1) {
        local_44 = 0;
      }
      else {
        iVar1 = step_mem->explicit;
        iVar2 = step_mem->implicit;
        lVar11 = 0;
        local_44 = 0;
        do {
          if (iVar1 != 0) {
            psVar4[local_44] = (step_mem->Be->b[lVar11] - step_mem->Be->d[lVar11]) * ark_mem->h;
            pp_Var5[local_44] = step_mem->Fe[lVar11];
            local_44 = local_44 + 1;
          }
          if (iVar2 != 0) {
            psVar4[local_44] = (step_mem->Bi->b[lVar11] - step_mem->Bi->d[lVar11]) * ark_mem->h;
            pp_Var5[local_44] = step_mem->Fi[lVar11];
            local_44 = local_44 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      lVar11 = 0x70;
      if ((step_mem->expforcing != 0) || (lVar11 = 0x78, step_mem->impforcing != 0)) {
        if (0 < iVar9) {
          lVar11 = *(long *)((long)&step_mem->fe + lVar11);
          lVar6 = *(long *)(lVar11 + 0x28);
          lVar12 = *(long *)(lVar11 + 0x18);
          lVar11 = *(long *)(lVar11 + 0x20);
          psVar7 = step_mem->stage_times;
          psVar8 = step_mem->stage_coefs;
          lVar13 = 0;
          do {
            psVar7[lVar13] = *(double *)(lVar12 + lVar13 * 8) * ark_mem->h + ark_mem->tn;
            psVar8[lVar13] =
                 (*(double *)(lVar11 + lVar13 * 8) - *(double *)(lVar6 + lVar13 * 8)) * ark_mem->h;
            lVar13 = lVar13 + 1;
          } while (lVar10 != lVar13);
        }
        arkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,iVar9,&local_44);
      }
      iVar9 = N_VLinearCombination(local_44,psVar4,pp_Var5,local_40);
      if (iVar9 != 0) {
        return -0x1c;
      }
      sVar15 = (sunrealtype)N_VWrmsNorm(local_40,ark_mem->ewt);
      *local_38 = sVar15;
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cj;
  sunrealtype* bj;
  sunrealtype* dj;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* Compute time step solution (if necessary) */
    /*   set arrays for fused vector operation */
    cvals[0] = ONE;
    Xvecs[0] = ark_mem->yn;
    nvec     = 1;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * bj[j];
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  /* Compute yerr (if temporal error estimation is enabled). */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
        dj = step_mem->Be->d;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
        dj = step_mem->Bi->d;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * (bj[j] - dj[j]);
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}